

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  SrcList *pSVar1;
  Parse *pParse;
  Select *pSVar2;
  int iVar3;
  Select *pSelect;
  int iVar4;
  SrcList_item *pSVar5;
  
  if (-1 < (char)p->selFlags) {
    p->selFlags = p->selFlags | 0x80;
    pSVar1 = p->pSrc;
    iVar3 = pSVar1->nSrc;
    if (0 < iVar3) {
      pParse = pWalker->pParse;
      pSVar5 = pSVar1->a;
      iVar4 = 0;
      do {
        if (((pSVar5->pTab->tabFlags & 2) != 0) &&
           (pSVar2 = pSVar5->pSelect, pSVar5->pSelect != (Select *)0x0)) {
          do {
            pSelect = pSVar2;
            pSVar2 = pSelect->pPrior;
          } while (pSVar2 != (Select *)0x0);
          sqlite3SelectAddColumnTypeAndCollation(pParse,pSVar5->pTab,pSelect);
          iVar3 = pSVar1->nSrc;
        }
        iVar4 = iVar4 + 1;
        pSVar5 = pSVar5 + 1;
      } while (iVar4 < iVar3);
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  struct SrcList_item *pFrom;

  assert( p->selFlags & SF_Resolved );
  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        while( pSel->pPrior ) pSel = pSel->pPrior;
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSel);
      }
    }
  }
}